

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

void __thiscall Fl_Input_::put_in_buffer(Fl_Input_ *this,int len)

{
  char *pcVar1;
  bool bVar2;
  char *nbuffer;
  int moveit;
  int len_local;
  Fl_Input_ *this_local;
  
  if ((this->value_ == this->buffer) && (len < this->bufsize)) {
    this->buffer[this->size_] = '\0';
  }
  else {
    if (this->bufsize == 0) {
      nbuffer._4_4_ = len;
      if (this->size_ < len) {
        nbuffer._4_4_ = len + 9;
      }
      this->bufsize = nbuffer._4_4_ + 1;
      pcVar1 = (char *)malloc((long)this->bufsize);
      this->buffer = pcVar1;
    }
    else if (this->bufsize <= len) {
      bVar2 = false;
      if (this->buffer <= this->value_) {
        bVar2 = this->value_ < this->buffer + this->bufsize;
      }
      if (this->size_ < len) {
        do {
          this->bufsize = this->bufsize << 1;
        } while (this->bufsize <= len);
      }
      else {
        this->bufsize = len + 1;
      }
      pcVar1 = (char *)realloc(this->buffer,(long)this->bufsize);
      if (bVar2) {
        this->value_ = this->value_ + ((long)pcVar1 - (long)this->buffer);
      }
      this->buffer = pcVar1;
    }
    memmove(this->buffer,this->value_,(long)this->size_);
    this->buffer[this->size_] = '\0';
    this->value_ = this->buffer;
  }
  return;
}

Assistant:

void Fl_Input_::put_in_buffer(int len) {
  if (value_ == buffer && bufsize > len) {
    buffer[size_] = 0;
    return;
  }
  if (!bufsize) {
    if (len > size_) len += 9; // let a few characters insert before realloc
    bufsize = len+1; 
    buffer = (char*)malloc(bufsize);
  } else if (bufsize <= len) {
    // we may need to move old value in case it points into buffer:
    int moveit = (value_ >= buffer && value_ < buffer+bufsize);
    // enlarge current buffer
    if (len > size_) {
      do {bufsize *= 2;} while (bufsize <= len);
    } else {
      bufsize = len+1;
    }
    // Note: the following code is equivalent to:
    //
    //   if (moveit) value_ = value_ - buffer;
    //   char* nbuffer = (char*)realloc(buffer, bufsize);
    //   if (moveit) value_ = value_ + nbuffer;
    //   buffer = nbuffer;
    //
    // We just optimized the pointer arithmetic for value_...
    //
    char* nbuffer = (char*)realloc(buffer, bufsize);
    if (moveit) value_ += (nbuffer-buffer);
    buffer = nbuffer;
  }
  memmove(buffer, value_, size_); buffer[size_] = 0;
  value_ = buffer;
}